

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O1

void BQMTester<cimod::Dense>::test_DenseConstructionTest_ConstructionMatrix2(void)

{
  double dVar1;
  __node_base *p_Var2;
  pointer *__ptr;
  char *pcVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertionResult gtest_ar;
  Matrix int_mat;
  Matrix m;
  BQM<std::string,_double,_cimod::Dense> bqm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_328;
  double local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  AssertHelper local_310;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_308;
  undefined8 *local_2c8;
  long local_2c0;
  long local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [24];
  undefined1 local_98 [8];
  pointer local_90;
  undefined1 local_80 [16];
  __node_base local_70;
  _Hash_node_base local_60 [2];
  __node_base *local_50 [2];
  __node_base local_40 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  local_b0._0_8_ = (pointer)0x4;
  local_b0._8_8_ = 4;
  local_b0._16_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_2c8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              *)local_b0);
  if ((0 < local_2c0) && (0 < local_2b8)) {
    *local_2c8 = 0x4035000000000000;
    if ((local_2c0 != 1) &&
       (((local_2b8 != 1 && (local_2c8[local_2b8 + 1] = 0x403a000000000000, 2 < local_2c0)) &&
        (2 < local_2b8)))) {
      local_2c8[local_2b8 * 2 + 2] = 0x403f000000000000;
      if ((3 < local_2c0) && (3 < local_2b8)) {
        local_2c8[local_2b8 * 3 + 3] = 0x4042000000000000;
        local_2c8[1] = 0x3ff0000000000000;
        local_2c8[2] = 0x4000000000000000;
        local_2c8[3] = &DAT_4008000000000000;
        local_2c8[local_2b8] = 0x4014000000000000;
        local_2c8[local_2b8 + 2] = 0x4018000000000000;
        local_2c8[local_2b8 + 3] = 0x401c000000000000;
        local_2c8[local_2b8 * 2] = 0x4022000000000000;
        local_2c8[local_2b8 * 2 + 1] = 0x4024000000000000;
        local_2c8[local_2b8 * 2 + 3] = 0x4026000000000000;
        local_2c8[local_2b8 * 3] = &DAT_402a000000000000;
        local_2c8[local_2b8 * 3 + 1] = 0x402c000000000000;
        local_2c8[local_2b8 * 3 + 2] = 0x402e000000000000;
        local_b0._0_8_ = local_b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"a","");
        local_90 = (pointer)local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"b","");
        local_70._M_nxt = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"d","");
        p_Var2 = local_40;
        local_50[0] = p_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"e","");
        __l._M_len = 4;
        __l._M_array = (iterator)local_b0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_30,__l,(allocator_type *)&local_308);
        lVar4 = -0x80;
        do {
          if (p_Var2 != p_Var2[-2]._M_nxt) {
            operator_delete(p_Var2[-2]._M_nxt,(ulong)((long)&p_Var2->_M_nxt->_M_nxt + 1));
          }
          p_Var2 = p_Var2 + -4;
          lVar4 = lVar4 + 0x20;
        } while (lVar4 != 0);
        local_308.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 0;
        local_308.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_308.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (double *)0x0;
        local_308.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = 0;
        local_308.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_data = (double *)0x0;
        local_308.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_rows = 0;
        local_308.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_cols = 0;
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
        construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   &local_308,&local_2c8);
        local_320 = 0.0;
        cimod::
        BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
        ::BinaryQuadraticModel
                  ((BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                    *)local_b0,&local_308,&local_30,&local_320,SPIN,true);
        free(local_308.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage
                  ((DenseStorage<double,__1,__1,__1,_1> *)&local_308,
                   (DenseStorage<double,__1,__1,__1,_1> *)local_b0);
        if ((0 < local_308.
                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 .
                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value) &&
           (0 < local_308.
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                .
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value)) {
          testing::internal::CmpHelperFloatingPointEQ<double>
                    ((internal *)&local_320,"int_mat(0,0)","0",
                     *local_308.
                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      .
                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_data,0.0);
          if (local_320._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_328);
            if (local_318 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = (local_318->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_310,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                       ,0xe4,pcVar3);
            testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328);
            testing::internal::AssertHelper::~AssertHelper(&local_310);
            if (local_328._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_328._M_head_impl + 8))();
            }
          }
          if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_318,local_318);
          }
          if ((0 < local_308.
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   .
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_rows.m_value) &&
             (1 < local_308.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value)) {
            testing::internal::CmpHelperFloatingPointEQ<double>
                      ((internal *)&local_320,"int_mat(0,1)","6",
                       local_308.
                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       .
                       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_data[1],6.0);
            if (local_320._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_328);
              if (local_318 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = (local_318->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_310,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                         ,0xe5,pcVar3);
              testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328);
              testing::internal::AssertHelper::~AssertHelper(&local_310);
              if (local_328._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_328._M_head_impl + 8))();
              }
            }
            if (local_318 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_318,local_318);
            }
            if ((0 < local_308.
                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                     .
                     super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                     .m_rows.m_value) &&
               (2 < local_308.
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    .
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_cols.m_value)) {
              testing::internal::CmpHelperFloatingPointEQ<double>
                        ((internal *)&local_320,"int_mat(0,2)","11",
                         local_308.
                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         .
                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_data[2],11.0);
              if (local_320._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_328);
                if (local_318 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_310,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                           ,0xe6,pcVar3);
                testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328);
                testing::internal::AssertHelper::~AssertHelper(&local_310);
                if (local_328._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_328._M_head_impl + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              if ((0 < local_308.
                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       .
                       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_rows.m_value) &&
                 (3 < local_308.
                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      .
                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_cols.m_value)) {
                testing::internal::CmpHelperFloatingPointEQ<double>
                          ((internal *)&local_320,"int_mat(0,3)","16",
                           local_308.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_data[3],16.0);
                if (local_320._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)&local_328);
                  if (local_318 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = (local_318->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_310,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                             ,0xe7,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328);
                  testing::internal::AssertHelper::~AssertHelper(&local_310);
                  if (local_328._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_328._M_head_impl + 8))();
                  }
                }
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_318,local_318);
                }
                if ((0 < local_308.
                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         .
                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_rows.m_value) &&
                   (4 < local_308.
                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        .
                        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                        .m_cols.m_value)) {
                  testing::internal::CmpHelperFloatingPointEQ<double>
                            ((internal *)&local_320,"int_mat(0,4)","21",
                             local_308.
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             .
                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                             .m_data[4],21.0);
                  if (local_320._0_1_ == (internal)0x0) {
                    testing::Message::Message((Message *)&local_328);
                    if (local_318 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = (local_318->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_310,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                               ,0xe8,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328);
                    testing::internal::AssertHelper::~AssertHelper(&local_310);
                    if (local_328._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_328._M_head_impl + 8))();
                    }
                  }
                  if (local_318 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_318,local_318);
                  }
                  if ((1 < local_308.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value) &&
                     (0 < local_308.
                          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                          .
                          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                          .m_cols.m_value)) {
                    testing::internal::CmpHelperFloatingPointEQ<double>
                              ((internal *)&local_320,"int_mat(1,0)","0",
                               local_308.
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               .
                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                               .m_data[local_308.
                                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                       .
                                       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                       .m_cols.m_value],0.0);
                    if (local_320._0_1_ == (internal)0x0) {
                      testing::Message::Message((Message *)&local_328);
                      if (local_318 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = (local_318->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_310,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                 ,0xe9,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328);
                      testing::internal::AssertHelper::~AssertHelper(&local_310);
                      if (local_328._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_328._M_head_impl + 8))();
                      }
                    }
                    if (local_318 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_318,local_318);
                    }
                    if ((1 < local_308.
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             .
                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                             .m_rows.m_value) &&
                       (1 < local_308.
                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                            .
                            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                            .m_cols.m_value)) {
                      testing::internal::CmpHelperFloatingPointEQ<double>
                                ((internal *)&local_320,"int_mat(1,1)","0",
                                 local_308.
                                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                 .
                                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                 .m_data[local_308.
                                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                         .
                                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                         .m_cols.m_value + 1],0.0);
                      if (local_320._0_1_ == (internal)0x0) {
                        testing::Message::Message((Message *)&local_328);
                        if (local_318 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar3 = "";
                        }
                        else {
                          pcVar3 = (local_318->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_310,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                   ,0xea,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_310);
                        if (local_328._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_328._M_head_impl + 8))();
                        }
                      }
                      if (local_318 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_318,local_318);
                      }
                      if ((1 < local_308.
                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               .
                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                               .m_rows.m_value) &&
                         (2 < local_308.
                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              .
                              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value)) {
                        testing::internal::CmpHelperFloatingPointEQ<double>
                                  ((internal *)&local_320,"int_mat(1,2)","16",
                                   local_308.
                                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                   .
                                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                   .m_data[local_308.
                                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                           .
                                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                           .m_cols.m_value + 2],16.0);
                        if (local_320._0_1_ == (internal)0x0) {
                          testing::Message::Message((Message *)&local_328);
                          if (local_318 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar3 = "";
                          }
                          else {
                            pcVar3 = (local_318->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_310,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                     ,0xeb,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    (&local_310,(Message *)&local_328);
                          testing::internal::AssertHelper::~AssertHelper(&local_310);
                          if (local_328._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_328._M_head_impl + 8))();
                          }
                        }
                        if (local_318 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_318,local_318);
                        }
                        if ((1 < local_308.
                                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                 .
                                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                 .m_rows.m_value) &&
                           (3 < local_308.
                                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                .
                                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                .m_cols.m_value)) {
                          testing::internal::CmpHelperFloatingPointEQ<double>
                                    ((internal *)&local_320,"int_mat(1,3)","21",
                                     local_308.
                                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                     .
                                     super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                     .m_data[local_308.
                                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                             .
                                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                             .m_cols.m_value + 3],21.0);
                          if (local_320._0_1_ == (internal)0x0) {
                            testing::Message::Message((Message *)&local_328);
                            if (local_318 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar3 = "";
                            }
                            else {
                              pcVar3 = (local_318->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_310,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                       ,0xec,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      (&local_310,(Message *)&local_328);
                            testing::internal::AssertHelper::~AssertHelper(&local_310);
                            if (local_328._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_328._M_head_impl + 8))();
                            }
                          }
                          if (local_318 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_318,local_318);
                          }
                          if ((1 < local_308.
                                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                   .
                                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                   .m_rows.m_value) &&
                             (4 < local_308.
                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                  .
                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                  .m_cols.m_value)) {
                            testing::internal::CmpHelperFloatingPointEQ<double>
                                      ((internal *)&local_320,"int_mat(1,4)","26",
                                       local_308.
                                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                       .
                                       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                       .m_data[local_308.
                                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                               .
                                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                               .m_cols.m_value + 4],26.0);
                            if (local_320._0_1_ == (internal)0x0) {
                              testing::Message::Message((Message *)&local_328);
                              if (local_318 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar3 = "";
                              }
                              else {
                                pcVar3 = (local_318->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_310,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                         ,0xed,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        (&local_310,(Message *)&local_328);
                              testing::internal::AssertHelper::~AssertHelper(&local_310);
                              if (local_328._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_328._M_head_impl + 8))();
                              }
                            }
                            if (local_318 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_318,local_318);
                            }
                            if ((2 < local_308.
                                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                     .
                                     super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                     .m_rows.m_value) &&
                               (0 < local_308.
                                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                    .
                                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                    .m_cols.m_value)) {
                              testing::internal::CmpHelperFloatingPointEQ<double>
                                        ((internal *)&local_320,"int_mat(2,0)","0",
                                         local_308.
                                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                         .
                                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                         .m_data[local_308.
                                                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                 .
                                                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                 .m_cols.m_value * 2],0.0);
                              if (local_320._0_1_ == (internal)0x0) {
                                testing::Message::Message((Message *)&local_328);
                                if (local_318 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar3 = "";
                                }
                                else {
                                  pcVar3 = (local_318->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_310,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                           ,0xee,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          (&local_310,(Message *)&local_328);
                                testing::internal::AssertHelper::~AssertHelper(&local_310);
                                if (local_328._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_328._M_head_impl + 8))();
                                }
                              }
                              if (local_318 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_318,local_318);
                              }
                              if ((2 < local_308.
                                       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                       .
                                       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                       .m_rows.m_value) &&
                                 (1 < local_308.
                                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                      .
                                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                      .m_cols.m_value)) {
                                testing::internal::CmpHelperFloatingPointEQ<double>
                                          ((internal *)&local_320,"int_mat(2,1)","0",
                                           local_308.
                                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                           .
                                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                           .m_data[local_308.
                                                                                                      
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 2 + 1],0.0);
                                if (local_320._0_1_ == (internal)0x0) {
                                  testing::Message::Message((Message *)&local_328);
                                  if (local_318 ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar3 = "";
                                  }
                                  else {
                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_310,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                             ,0xef,pcVar3);
                                  testing::internal::AssertHelper::operator=
                                            (&local_310,(Message *)&local_328);
                                  testing::internal::AssertHelper::~AssertHelper(&local_310);
                                  if (local_328._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_328._M_head_impl + 8))();
                                  }
                                }
                                if (local_318 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_318,local_318);
                                }
                                if ((2 < local_308.
                                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                         .
                                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                         .m_rows.m_value) &&
                                   (2 < local_308.
                                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                        .
                                        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                        .m_cols.m_value)) {
                                  testing::internal::CmpHelperFloatingPointEQ<double>
                                            ((internal *)&local_320,"int_mat(2,2)","0",
                                             local_308.
                                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                             .
                                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                             .m_data[local_308.
                                                                                                          
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 2 + 2],0.0);
                                  if (local_320._0_1_ == (internal)0x0) {
                                    testing::Message::Message((Message *)&local_328);
                                    if (local_318 ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar3 = "";
                                    }
                                    else {
                                      pcVar3 = (local_318->_M_dataplus)._M_p;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_310,kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                               ,0xf0,pcVar3);
                                    testing::internal::AssertHelper::operator=
                                              (&local_310,(Message *)&local_328);
                                    testing::internal::AssertHelper::~AssertHelper(&local_310);
                                    if (local_328._M_head_impl !=
                                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      (**(code **)(*(long *)local_328._M_head_impl + 8))();
                                    }
                                  }
                                  if (local_318 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                  }
                                  if ((2 < local_308.
                                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                           .
                                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                           .m_rows.m_value) &&
                                     (3 < local_308.
                                          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                          .
                                          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                          .m_cols.m_value)) {
                                    testing::internal::CmpHelperFloatingPointEQ<double>
                                              ((internal *)&local_320,"int_mat(2,3)","26",
                                               local_308.
                                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                               .
                                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                               .m_data[local_308.
                                                                                                              
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 2 + 3],26.0);
                                    if (local_320._0_1_ == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_328);
                                      if (local_318 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar3 = "";
                                      }
                                      else {
                                        pcVar3 = (local_318->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_310,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                 ,0xf1,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                (&local_310,(Message *)&local_328);
                                      testing::internal::AssertHelper::~AssertHelper(&local_310);
                                      if (local_328._M_head_impl !=
                                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        (**(code **)(*(long *)local_328._M_head_impl + 8))();
                                      }
                                    }
                                    if (local_318 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                    }
                                    if ((2 < local_308.
                                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                             .
                                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                             .m_rows.m_value) &&
                                       (4 < local_308.
                                            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                            .
                                            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                            .m_cols.m_value)) {
                                      testing::internal::CmpHelperFloatingPointEQ<double>
                                                ((internal *)&local_320,"int_mat(2,4)","31",
                                                 local_308.
                                                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                 .
                                                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                 .m_data[local_308.
                                                                                                                  
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 2 + 4],31.0);
                                      if (local_320._0_1_ == (internal)0x0) {
                                        testing::Message::Message((Message *)&local_328);
                                        if (local_318 ==
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          pcVar3 = "";
                                        }
                                        else {
                                          pcVar3 = (local_318->_M_dataplus)._M_p;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_310,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xf2,pcVar3);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_310,(Message *)&local_328);
                                        testing::internal::AssertHelper::~AssertHelper(&local_310);
                                        if (local_328._M_head_impl !=
                                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          (**(code **)(*(long *)local_328._M_head_impl + 8))();
                                        }
                                      }
                                      if (local_318 !=
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                      }
                                      if ((3 < local_308.
                                               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                               .
                                               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                               .m_rows.m_value) &&
                                         (0 < local_308.
                                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                              .
                                              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                              .m_cols.m_value)) {
                                        testing::internal::CmpHelperFloatingPointEQ<double>
                                                  ((internal *)&local_320,"int_mat(3,0)","0",
                                                   local_308.
                                                                                                      
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 3],0.0);
                                        if (local_320._0_1_ == (internal)0x0) {
                                          testing::Message::Message((Message *)&local_328);
                                          if (local_318 ==
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            pcVar3 = "";
                                          }
                                          else {
                                            pcVar3 = (local_318->_M_dataplus)._M_p;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_310,kNonFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xf3,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_310,(Message *)&local_328);
                                          testing::internal::AssertHelper::~AssertHelper(&local_310)
                                          ;
                                          if (local_328._M_head_impl !=
                                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            (**(code **)(*(long *)local_328._M_head_impl + 8))();
                                          }
                                        }
                                        if (local_318 !=
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          std::
                                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                        }
                                        if ((3 < local_308.
                                                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                 .
                                                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                 .m_rows.m_value) &&
                                           (1 < local_308.
                                                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                .
                                                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                .m_cols.m_value)) {
                                          testing::internal::CmpHelperFloatingPointEQ<double>
                                                    ((internal *)&local_320,"int_mat(3,1)","0",
                                                     local_308.
                                                                                                          
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 3 + 1],0.0);
                                          if (local_320._0_1_ == (internal)0x0) {
                                            testing::Message::Message((Message *)&local_328);
                                            if (local_318 ==
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              pcVar3 = "";
                                            }
                                            else {
                                              pcVar3 = (local_318->_M_dataplus)._M_p;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_310,kNonFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xf4,pcVar3);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_310,(Message *)&local_328);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_310);
                                            if (local_328._M_head_impl !=
                                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              (**(code **)(*(long *)local_328._M_head_impl + 8))();
                                            }
                                          }
                                          if (local_318 !=
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            std::
                                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                          }
                                          if ((3 < local_308.
                                                                                                      
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value) &&
                                             (2 < local_308.
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value)) {
                                            testing::internal::CmpHelperFloatingPointEQ<double>
                                                      ((internal *)&local_320,"int_mat(3,2)","0",
                                                       local_308.
                                                                                                              
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 3 + 2],0.0);
                                            if (local_320._0_1_ == (internal)0x0) {
                                              testing::Message::Message((Message *)&local_328);
                                              if (local_318 ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                pcVar3 = "";
                                              }
                                              else {
                                                pcVar3 = (local_318->_M_dataplus)._M_p;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_310,kNonFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xf5,pcVar3);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_310,(Message *)&local_328);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_310);
                                              if (local_328._M_head_impl !=
                                                  (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                (**(code **)(*(long *)local_328._M_head_impl + 8))()
                                                ;
                                              }
                                            }
                                            if (local_318 !=
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              std::
                                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                            }
                                            if ((3 < local_308.
                                                                                                          
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value) &&
                                               (3 < local_308.
                                                                                                        
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value)) {
                                              testing::internal::CmpHelperFloatingPointEQ<double>
                                                        ((internal *)&local_320,"int_mat(3,3)","0",
                                                         local_308.
                                                                                                                  
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 3 + 3],0.0);
                                              if (local_320._0_1_ == (internal)0x0) {
                                                testing::Message::Message((Message *)&local_328);
                                                if (local_318 ==
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  pcVar3 = "";
                                                }
                                                else {
                                                  pcVar3 = (local_318->_M_dataplus)._M_p;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_310,kNonFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xf6,pcVar3);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_310,(Message *)&local_328);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_310);
                                                if (local_328._M_head_impl !=
                                                    (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  (**(code **)(*(long *)local_328._M_head_impl + 8))
                                                            ();
                                                }
                                              }
                                              if (local_318 !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                std::
                                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                              }
                                              if ((3 < local_308.
                                                                                                              
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value) &&
                                                 (4 < local_308.
                                                                                                            
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value)) {
                                                testing::internal::CmpHelperFloatingPointEQ<double>
                                                          ((internal *)&local_320,"int_mat(3,4)",
                                                           "36",local_308.
                                                                                                                                
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 3 + 4],36.0);
                                                if (local_320._0_1_ == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_328);
                                                  if (local_318 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xf7,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                }
                                                if (local_318 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                }
                                                if ((4 < local_308.
                                                                                                                  
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value) &&
                                                  (0 < local_308.
                                                                                                              
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value)) {
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,"int_mat(4,0)",
                                                             "0",local_308.
                                                                                                                                  
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 4],0.0);
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xf8,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  if ((4 < local_308.
                                                                                                                      
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value) &&
                                                  (1 < local_308.
                                                                                                              
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)&local_320,"int_mat(4,1)"
                                                               ,"0",local_308.
                                                                                                                                        
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 4 + 1],0.0);
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xf9,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  if ((4 < local_308.
                                                                                                                      
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value) &&
                                                  (2 < local_308.
                                                                                                              
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)&local_320,"int_mat(4,2)"
                                                               ,"0",local_308.
                                                                                                                                        
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 4 + 2],0.0);
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xfa,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  if ((4 < local_308.
                                                                                                                      
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value) &&
                                                  (3 < local_308.
                                                                                                              
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)&local_320,"int_mat(4,3)"
                                                               ,"0",local_308.
                                                                                                                                        
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 4 + 3],0.0);
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xfb,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  if ((4 < local_308.
                                                                                                                      
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value) &&
                                                  (4 < local_308.
                                                                                                              
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value)) {
                                                    testing::internal::
                                                    CmpHelperFloatingPointEQ<double>
                                                              ((internal *)&local_320,"int_mat(4,4)"
                                                               ,"1",local_308.
                                                                                                                                        
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data[local_308.
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value * 4 + 4],1.0);
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0xfc,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_d0._M_dataplus._M_p =
                                                       (pointer)&local_d0.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_d0,"a","");
                                                  local_f0._M_dataplus._M_p =
                                                       (pointer)&local_f0.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_f0,"b","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_d0,&local_f0);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_quadratic(\"a\", \"b\")","6",
                                                             dVar1,6.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_f0._M_dataplus._M_p != &local_f0.field_2)
                                                  {
                                                    operator_delete(local_f0._M_dataplus._M_p,
                                                                    local_f0.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_d0._M_dataplus._M_p != &local_d0.field_2)
                                                  {
                                                    operator_delete(local_d0._M_dataplus._M_p,
                                                                    local_d0.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x100,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_110._M_dataplus._M_p =
                                                       (pointer)&local_110.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_110,"a","");
                                                  local_130._M_dataplus._M_p =
                                                       (pointer)&local_130.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_130,"d","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_110,&local_130);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_quadratic(\"a\", \"d\")","11",
                                                             dVar1,11.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_130._M_dataplus._M_p != &local_130.field_2
                                                  ) {
                                                    operator_delete(local_130._M_dataplus._M_p,
                                                                    local_130.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_110._M_dataplus._M_p != &local_110.field_2
                                                  ) {
                                                    operator_delete(local_110._M_dataplus._M_p,
                                                                    local_110.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x101,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_150._M_dataplus._M_p =
                                                       (pointer)&local_150.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_150,"a","");
                                                  local_170._M_dataplus._M_p =
                                                       (pointer)&local_170.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_170,"e","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_150,&local_170);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_quadratic(\"a\", \"e\")","16",
                                                             dVar1,16.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_170._M_dataplus._M_p != &local_170.field_2
                                                  ) {
                                                    operator_delete(local_170._M_dataplus._M_p,
                                                                    local_170.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_150._M_dataplus._M_p != &local_150.field_2
                                                  ) {
                                                    operator_delete(local_150._M_dataplus._M_p,
                                                                    local_150.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x102,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_190._M_dataplus._M_p =
                                                       (pointer)&local_190.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_190,"b","");
                                                  local_1b0._M_dataplus._M_p =
                                                       (pointer)&local_1b0.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_1b0,"d","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_190,&local_1b0);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_quadratic(\"b\", \"d\")","16",
                                                             dVar1,16.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1b0._M_dataplus._M_p != &local_1b0.field_2
                                                  ) {
                                                    operator_delete(local_1b0._M_dataplus._M_p,
                                                                    local_1b0.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_190._M_dataplus._M_p != &local_190.field_2
                                                  ) {
                                                    operator_delete(local_190._M_dataplus._M_p,
                                                                    local_190.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x103,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_1d0._M_dataplus._M_p =
                                                       (pointer)&local_1d0.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_1d0,"b","");
                                                  local_1f0._M_dataplus._M_p =
                                                       (pointer)&local_1f0.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_1f0,"e","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_1d0,&local_1f0);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_quadratic(\"b\", \"e\")","21",
                                                             dVar1,21.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1f0._M_dataplus._M_p != &local_1f0.field_2
                                                  ) {
                                                    operator_delete(local_1f0._M_dataplus._M_p,
                                                                    local_1f0.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1d0._M_dataplus._M_p != &local_1d0.field_2
                                                  ) {
                                                    operator_delete(local_1d0._M_dataplus._M_p,
                                                                    local_1d0.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x104,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_210._M_dataplus._M_p =
                                                       (pointer)&local_210.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_210,"d","");
                                                  local_230._M_dataplus._M_p =
                                                       (pointer)&local_230.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_230,"e","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_quadratic((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_210,&local_230);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_quadratic(\"d\", \"e\")","26",
                                                             dVar1,26.0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_230._M_dataplus._M_p != &local_230.field_2
                                                  ) {
                                                    operator_delete(local_230._M_dataplus._M_p,
                                                                    local_230.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_210._M_dataplus._M_p != &local_210.field_2
                                                  ) {
                                                    operator_delete(local_210._M_dataplus._M_p,
                                                                    local_210.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x105,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_250._M_dataplus._M_p =
                                                       (pointer)&local_250.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_250,"a","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_linear((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_250);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_linear(\"a\")","21",dVar1,21.0
                                                            );
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_250._M_dataplus._M_p != &local_250.field_2
                                                  ) {
                                                    operator_delete(local_250._M_dataplus._M_p,
                                                                    local_250.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x107,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_270._M_dataplus._M_p =
                                                       (pointer)&local_270.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_270,"b","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_linear((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_270);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_linear(\"b\")","26",dVar1,26.0
                                                            );
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_270._M_dataplus._M_p != &local_270.field_2
                                                  ) {
                                                    operator_delete(local_270._M_dataplus._M_p,
                                                                    local_270.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x108,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_290._M_dataplus._M_p =
                                                       (pointer)&local_290.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_290,"d","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_linear((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_290);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_linear(\"d\")","31",dVar1,31.0
                                                            );
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_290._M_dataplus._M_p != &local_290.field_2
                                                  ) {
                                                    operator_delete(local_290._M_dataplus._M_p,
                                                                    local_290.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x109,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  local_2b0._M_dataplus._M_p =
                                                       (pointer)&local_2b0.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_2b0,"e","");
                                                  dVar1 = cimod::
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  ::get_linear((
                                                  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                                                  *)local_b0,&local_2b0);
                                                  testing::internal::
                                                  CmpHelperFloatingPointEQ<double>
                                                            ((internal *)&local_320,
                                                             "bqm.get_linear(\"e\")","36",dVar1,36.0
                                                            );
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_2b0._M_dataplus._M_p != &local_2b0.field_2
                                                  ) {
                                                    operator_delete(local_2b0._M_dataplus._M_p,
                                                                    local_2b0.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (local_320._0_1_ == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_328)
                                                    ;
                                                    if (local_318 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    pcVar3 = (local_318->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_310,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                                                  ,0x10a,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_310,(Message *)&local_328);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_310);
                                                  if (local_328._M_head_impl !=
                                                      (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    (**(code **)(*(long *)local_328._M_head_impl + 8
                                                                ))();
                                                  }
                                                  }
                                                  if (local_318 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_318,local_318);
                                                  }
                                                  free(local_308.
                                                                                                              
                                                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  .
                                                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data);
                                                  std::
                                                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                                  ::~_Hashtable((
                                                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                                  *)local_80);
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_98);
                                                  free((void *)local_b0._0_8_);
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector(&local_30);
                                                  free(local_2c8);
                                                  return;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

static void test_DenseConstructionTest_ConstructionMatrix2()
    {
        using Matrix = Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor>;
        Matrix m = Matrix::Zero(4,4);
        m(0,0) = 21;
        m(1,1) = 26;
        m(2,2) = 31;
        m(3,3) = 36;

        m(0,1) = 1;
        m(0,2) = 2;
        m(0,3) = 3;

        m(1,0) = 5;
        m(1,2) = 6;
        m(1,3) = 7;

        m(2,0) = 9;
        m(2,1) = 10;
        m(2,3) = 11;

        m(3,0) = 13;
        m(3,1) = 14;
        m(3,2) = 15;

        auto labels = std::vector<std::string>{"a", "b", "d", "e"};

        BQM<std::string, double, DataType> bqm(m, labels, 0.0, Vartype::SPIN);

        Matrix int_mat = bqm.interaction_matrix();
        EXPECT_DOUBLE_EQ(int_mat(0,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(0,1), 6);
        EXPECT_DOUBLE_EQ(int_mat(0,2), 11);
        EXPECT_DOUBLE_EQ(int_mat(0,3), 16);
        EXPECT_DOUBLE_EQ(int_mat(0,4), 21);
        EXPECT_DOUBLE_EQ(int_mat(1,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(1,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(1,2), 16);
        EXPECT_DOUBLE_EQ(int_mat(1,3), 21);
        EXPECT_DOUBLE_EQ(int_mat(1,4), 26);
        EXPECT_DOUBLE_EQ(int_mat(2,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(2,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(2,2), 0);
        EXPECT_DOUBLE_EQ(int_mat(2,3), 26);
        EXPECT_DOUBLE_EQ(int_mat(2,4), 31);
        EXPECT_DOUBLE_EQ(int_mat(3,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,2), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,3), 0);
        EXPECT_DOUBLE_EQ(int_mat(3,4), 36);
        EXPECT_DOUBLE_EQ(int_mat(4,0), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,1), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,2), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,3), 0);
        EXPECT_DOUBLE_EQ(int_mat(4,4), 1);

        //check elements

        EXPECT_DOUBLE_EQ(bqm.get_quadratic("a", "b"), 6);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("a", "d"), 11);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("a", "e"), 16);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("b", "d"), 16);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("b", "e"), 21);
        EXPECT_DOUBLE_EQ(bqm.get_quadratic("d", "e"), 26);

        EXPECT_DOUBLE_EQ(bqm.get_linear("a"), 21);
        EXPECT_DOUBLE_EQ(bqm.get_linear("b"), 26);
        EXPECT_DOUBLE_EQ(bqm.get_linear("d"), 31);
        EXPECT_DOUBLE_EQ(bqm.get_linear("e"), 36);
    }